

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

bool __thiscall
flatbuffers::python::PythonGenerator::SaveType
          (PythonGenerator *this,string *defname,Namespace *ns,string *classcode,ImportMap *imports,
          string *mod,bool needs_imports)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  _Alloc_hider name;
  bool bVar4;
  long *plVar5;
  long lVar6;
  size_type *psVar7;
  Namespace *ns_00;
  char *__end;
  string directories;
  string code;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [32];
  _Base_ptr local_88;
  size_t sStack_80;
  string local_78;
  string *local_58;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_58 = defname;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  if (classcode->_M_string_length == 0) {
    BaseGenerator::LastNamespacePart_abi_cxx11_(&local_e8,(BaseGenerator *)ns,ns_00);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
    local_a8._24_8_ = local_a8 + 8;
    local_a8._16_8_ = 0;
    local_a8._0_8_ = (pointer)0x0;
    local_a8._8_8_ = 0;
    sStack_80 = 0;
    local_88 = (_Base_ptr)local_a8._24_8_;
    BeginFile(this,&local_e8,false,&local_78,&local_c8,(ImportMap *)local_a8);
    std::
    _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_e8,"# NOTE ",local_58);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      local_a8._16_8_ = *psVar7;
      local_a8._24_8_ = plVar5[3];
      local_a8._0_8_ = local_a8 + 0x10;
    }
    else {
      local_a8._16_8_ = *psVar7;
      local_a8._0_8_ = (size_type *)*plVar5;
    }
    local_a8._8_8_ = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_78,local_a8._0_8_);
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    BaseGenerator::LastNamespacePart_abi_cxx11_((string *)local_a8,(BaseGenerator *)ns,ns_00);
    BeginFile(this,(string *)local_a8,needs_imports,&local_78,mod,imports);
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_78,(ulong)(classcode->_M_dataplus)._M_p);
  }
  if ((((this->super_BaseGenerator).parser_)->opts).one_file == true) {
    psVar2 = (this->super_BaseGenerator).path_;
    local_a8._0_8_ = local_a8 + 0x10;
    pcVar3 = (psVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,pcVar3,pcVar3 + psVar2->_M_string_length);
  }
  else {
    Namer::Directories((string *)local_a8,&(this->namer_).super_Namer,&ns->components,None,
                       kUpperCamel);
  }
  EnsureDirExists((string *)local_a8);
  if (((this->super_BaseGenerator).path_)->_M_string_length != 0xfffffffffffffffe) {
    paVar1 = &local_c8.field_2;
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)local_a8);
      plVar5 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_c8.field_2._M_allocated_capacity = *psVar7;
        local_c8.field_2._8_8_ = plVar5[3];
        local_c8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar7;
        local_c8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_c8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_e8.field_2._M_allocated_capacity = *psVar7;
        local_e8.field_2._8_8_ = plVar5[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar7;
        local_e8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_e8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      name._M_p = local_e8._M_dataplus._M_p;
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"","");
      SaveFile(name._M_p,local_c8._M_dataplus._M_p,local_c8._M_string_length,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      lVar6 = std::__cxx11::string::find((char)local_a8,0x2f);
    } while (lVar6 != -1);
  }
  std::operator+(&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 local_58);
  bVar4 = SaveFile(local_e8._M_dataplus._M_p,local_78._M_dataplus._M_p,local_78._M_string_length,
                   false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool SaveType(const std::string &defname, const Namespace &ns,
                const std::string &classcode, const ImportMap &imports,
                const std::string &mod, bool needs_imports) const {
    std::string code = "";
    if (classcode.empty()) {
      BeginFile(LastNamespacePart(ns), false, &code, "", {});
      code += "# NOTE " + defname + " does not declare any structs or enums\n";
    } else {
      BeginFile(LastNamespacePart(ns), needs_imports, &code, mod, imports);
      code += classcode;
    }

    const std::string directories =
        parser_.opts.one_file ? path_ : namer_.Directories(ns.components);
    EnsureDirExists(directories);

    for (size_t i = path_.size() + 1; i != std::string::npos;
         i = directories.find(kPathSeparator, i + 1)) {
      const std::string init_py =
          directories.substr(0, i) + kPathSeparator + "__init__.py";
      SaveFile(init_py.c_str(), "", false);
    }

    const std::string filename = directories + defname;
    return SaveFile(filename.c_str(), code, false);
  }